

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

int glfwGetError(char **description)

{
  int local_1c;
  _GLFWerror *p_Stack_18;
  int code;
  _GLFWerror *error;
  char **description_local;
  
  local_1c = 0;
  if (description != (char **)0x0) {
    *description = (char *)0x0;
  }
  if (_glfw.initialized == 0) {
    p_Stack_18 = &_glfwMainThreadError;
  }
  else {
    p_Stack_18 = (_GLFWerror *)_glfwPlatformGetTls(&_glfw.errorSlot);
  }
  if (p_Stack_18 != (_GLFWerror *)0x0) {
    local_1c = p_Stack_18->code;
    p_Stack_18->code = 0;
    if ((description != (char **)0x0) && (local_1c != 0)) {
      *description = p_Stack_18->description;
    }
  }
  return local_1c;
}

Assistant:

GLFWAPI int glfwGetError(const char** description)
{
    _GLFWerror* error;
    int code = GLFW_NO_ERROR;

    if (description)
        *description = NULL;

    if (_glfw.initialized)
        error = _glfwPlatformGetTls(&_glfw.errorSlot);
    else
        error = &_glfwMainThreadError;

    if (error)
    {
        code = error->code;
        error->code = GLFW_NO_ERROR;
        if (description && code)
            *description = error->description;
    }

    return code;
}